

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void __thiscall
amrex::ParmParse::getarr
          (ParmParse *this,char *name,vector<long,_std::allocator<long>_> *ptr,int start_ix,
          int num_val)

{
  Table *table;
  allocator local_71;
  string local_70;
  string local_50;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_50,name,&local_71);
  prefixedName(&local_70,this,&local_50);
  anon_unknown_12::anon_unknown_0::sgetarr<long>(table,&local_70,ptr,start_ix,num_val,-1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
ParmParse::getarr (const char* name,
                   std::vector<long>& ptr,
                   int         start_ix,
                   int         num_val) const
{
    sgetarr(m_table, prefixedName(name),ptr,start_ix,num_val, LAST);
}